

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest_main.cc
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  int local_20;
  int i;
  bool unwind_tests;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  argv_local._0_4_ = argc;
  testing::InitGoogleMock((int *)&argv_local,argv);
  bssl::SetupGoogleTest();
  bVar1 = true;
  for (local_20 = 1; local_20 < (int)argv_local; local_20 = local_20 + 1) {
    iVar2 = strcmp(argv[local_20],"--fork_unsafe_buffering");
    if (iVar2 == 0) {
      RAND_enable_fork_unsafe_buffering(-1);
    }
    iVar2 = strcmp(argv[local_20],"--no_unwind_tests");
    if (iVar2 == 0) {
      bVar1 = false;
    }
  }
  if (bVar1) {
    abi_test::EnableUnwindTests();
  }
  iVar2 = RUN_ALL_TESTS();
  return iVar2;
}

Assistant:

int main(int argc, char **argv) {
  testing::InitGoogleMock(&argc, argv);
  bssl::SetupGoogleTest();

  bool unwind_tests = true;
  for (int i = 1; i < argc; i++) {
#if !defined(OPENSSL_WINDOWS)
    if (strcmp(argv[i], "--fork_unsafe_buffering") == 0) {
      RAND_enable_fork_unsafe_buffering(-1);
    }
#endif

#if (defined(OPENSSL_ARM) || defined(OPENSSL_AARCH64)) && \
    !defined(OPENSSL_STATIC_ARMCAP)
    if (strncmp(argv[i], "--cpu=", 6) == 0) {
      const char *cpu = argv[i] + 6;
      uint32_t armcap;
      if (strcmp(cpu, "none") == 0) {
        armcap = 0;
      } else if (strcmp(cpu, "neon") == 0) {
        armcap = ARMV7_NEON;
      } else if (strcmp(cpu, "crypto") == 0) {
        armcap = ARMV7_NEON | ARMV8_AES | ARMV8_SHA1 | ARMV8_SHA256 | ARMV8_PMULL;
      } else {
        fprintf(stderr, "Unknown CPU: %s\n", cpu);
        exit(1);
      }

      uint32_t *armcap_ptr = OPENSSL_get_armcap_pointer_for_test();
      if ((armcap & *armcap_ptr) != armcap) {
        fprintf(stderr,
                "Host CPU does not support features for testing CPU '%s'.\n",
                cpu);
        exit(89);
      }
      printf("Simulating CPU '%s'\n", cpu);
      *armcap_ptr = armcap;
    }
#endif  // (ARM || AARCH64) && !STATIC_ARMCAP

    if (strcmp(argv[i], "--no_unwind_tests") == 0) {
      unwind_tests = false;
    }
  }

  if (unwind_tests) {
    abi_test::EnableUnwindTests();
  }

  return RUN_ALL_TESTS();
}